

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::push
          (QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *this,
          Intersection *x)

{
  qsizetype qVar1;
  Intersection *pIVar2;
  void *in_RSI;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *in_RDI;
  int parent;
  int current;
  Intersection *in_stack_ffffffffffffffc8;
  Intersection *in_stack_ffffffffffffffd0;
  undefined1 local_21;
  undefined4 local_18;
  undefined4 local_14;
  
  qVar1 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::size(in_RDI);
  local_14 = (int)qVar1;
  local_18 = QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::parent
                       (local_14);
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::add
            ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  while( true ) {
    local_21 = false;
    if (local_14 != 0) {
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::at
                (in_RDI,(long)local_18);
      local_21 = QTriangulator<unsigned_short>::ComplexToSimple::Intersection::operator<
                           (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    if (local_21 == false) break;
    in_stack_ffffffffffffffd0 =
         QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::at
                   (in_RDI,(long)local_18);
    pIVar2 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::at
                       (in_RDI,(long)local_14);
    memcpy(pIVar2,in_stack_ffffffffffffffd0,0x38);
    local_14 = local_18;
    local_18 = QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::parent
                         (local_18);
  }
  pIVar2 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::at
                     (in_RDI,(long)local_14);
  memcpy(pIVar2,in_RSI,0x38);
  return;
}

Assistant:

void QMaxHeap<T>::push(const T &x)
{
    int current = m_data.size();
    int parent = QMaxHeap::parent(current);
    m_data.add(x);
    while (current != 0 && m_data.at(parent) < x) {
        m_data.at(current) = m_data.at(parent);
        current = parent;
        parent = QMaxHeap::parent(current);
    }
    m_data.at(current) = x;
}